

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O2

ssize_t __thiscall
ControlProtocolState::read(ControlProtocolState *this,int __fd,void *__buf,size_t __nbytes)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  void *pvVar3;
  char *__s;
  undefined4 in_register_00000034;
  ulong uStack_70;
  StringRef local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  __lhs = &this->partialMsg;
  do {
    uStack_70 = 0;
    if (__buf == (void *)0x0) {
LAB_001a676a:
      return uStack_70 & 0xffffffff;
    }
    local_60.Data = __s;
    local_60.Length = (size_t)__buf;
    pvVar3 = memchr(__s,10,(size_t)__buf);
    if ((pvVar3 == (void *)0x0) ||
       (pvVar3 = (void *)((long)pvVar3 - (long)__s), pvVar3 == (void *)0xffffffffffffffff)) {
      if (this->maxLength < (long)__buf + (this->partialMsg)._M_string_length) {
        (this->partialMsg)._M_string_length = 0;
        *(this->partialMsg)._M_dataplus._M_p = '\0';
        uStack_70 = 0xffffffffffffffff;
        if (__nbytes != 0) {
          std::__cxx11::string::assign((char *)__nbytes);
        }
      }
      else {
        llvm::StringRef::str_abi_cxx11_(&local_50,&local_60);
        std::__cxx11::string::append((string *)__lhs);
        std::__cxx11::string::_M_dispose();
        uStack_70 = 0;
      }
      goto LAB_001a676a;
    }
    std::__cxx11::string::append((char *)__lhs,(ulong)__s);
    if (this->negotiated != false) {
      _Var2 = std::operator==(__lhs,&this->controlID);
      if (_Var2) {
        this->releaseSeen = true;
      }
      if (__nbytes != 0) {
        std::__cxx11::string::assign((char *)__nbytes);
      }
      (this->partialMsg)._M_string_length = 0;
      *(this->partialMsg)._M_dataplus._M_p = '\0';
      uStack_70 = 1;
      goto LAB_001a676a;
    }
    bVar1 = std::operator!=(__lhs,"llbuild.1");
    if (bVar1) {
      if (__nbytes != 0) {
        std::operator+(&local_50,"unsupported protocol: ",__lhs);
        std::__cxx11::string::operator=((string *)__nbytes,(string *)&local_50);
        std::__cxx11::string::_M_dispose();
      }
      (this->partialMsg)._M_string_length = 0;
      *(this->partialMsg)._M_dataplus._M_p = '\0';
      uStack_70 = 0xffffffffffffffff;
      goto LAB_001a676a;
    }
    this->negotiated = true;
    (this->partialMsg)._M_string_length = 0;
    *(this->partialMsg)._M_dataplus._M_p = '\0';
    if (__buf <= pvVar3) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    __s = __s + (long)pvVar3 + 1;
    __buf = (void *)((long)__buf - ((long)pvVar3 + 1));
  } while( true );
}

Assistant:

int read(StringRef buf, std::string* errstr = nullptr) {
    while (buf.size()) {
      size_t nl = buf.find('\n');
      if (nl == StringRef::npos) {
        if (partialMsg.size() + buf.size() > maxLength) {
          // protocol fault, msg length exceeded maximum
          partialMsg.clear();
          if (errstr) {
            *errstr = "excessive message length";
          }
          return -1;
        }

        // incomplete msg, store and continue
        partialMsg += buf.str();
        return 0;
      }

      partialMsg += buf.slice(0, nl);

      if (!negotiated) {
        // negotiate protocol version
        if (partialMsg != "llbuild.1") {
          // incompatible protocol version
          if (errstr) {
            *errstr = "unsupported protocol: " + partialMsg;
          }
          partialMsg.clear();
          return -1;
        }
        negotiated = true;
      } else {
        // check for supported control message
        if (partialMsg == controlID) {
          releaseSeen = true;
        }

        // We halt receiving anything after the first control message
        if (errstr) {
          *errstr = "bad ID";
        }
        partialMsg.clear();
        return 1;
      }

      partialMsg.clear();
      buf = buf.drop_front(nl + 1);
    }
    return 0;
  }